

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::SerializeWithCachedSizes
          (NeuralNetworkPreprocessing *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  uint32 uVar3;
  
  psVar1 = (this->featurename_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.NeuralNetworkPreprocessing.featureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (1,(this->featurename_).ptr_,output);
  }
  uVar3 = this->_oneof_case_[0];
  if (uVar3 == 10) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&((this->preprocessor_).scaler_)->super_MessageLite,output);
    uVar3 = this->_oneof_case_[0];
  }
  if (uVar3 == 0xb) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xb,&((this->preprocessor_).scaler_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void NeuralNetworkPreprocessing::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NeuralNetworkPreprocessing)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string featureName = 1;
  if (this->featurename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->featurename().data(), this->featurename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NeuralNetworkPreprocessing.featureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->featurename(), output);
  }

  // .CoreML.Specification.NeuralNetworkImageScaler scaler = 10;
  if (has_scaler()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *preprocessor_.scaler_, output);
  }

  // .CoreML.Specification.NeuralNetworkMeanImage meanImage = 11;
  if (has_meanimage()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      11, *preprocessor_.meanimage_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NeuralNetworkPreprocessing)
}